

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_at_rune(nk_str *str,int pos,char *cstr,int len)

{
  char *pcVar1;
  char *pcVar2;
  char *buffer;
  char *begin;
  int local_30;
  nk_rune unicode;
  int glyph_len;
  int len_local;
  char *cstr_local;
  nk_str *pnStack_18;
  int pos_local;
  nk_str *str_local;
  
  unicode = len;
  _glyph_len = cstr;
  cstr_local._4_4_ = pos;
  pnStack_18 = str;
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x20f1,"int nk_str_insert_at_rune(struct nk_str *, int, const char *, int)");
  }
  if (cstr != (char *)0x0) {
    if (len != 0) {
      if (((str == (nk_str *)0x0) || (cstr == (char *)0x0)) || (len == 0)) {
        str_local._4_4_ = 0;
      }
      else {
        pcVar1 = nk_str_at_rune(str,pos,(nk_rune *)((long)&begin + 4),&local_30);
        if (pnStack_18->len == 0) {
          str_local._4_4_ = nk_str_append_text_char(pnStack_18,_glyph_len,unicode);
        }
        else {
          pcVar2 = nk_str_get_const(pnStack_18);
          if (pcVar1 == (char *)0x0) {
            str_local._4_4_ = 0;
          }
          else {
            str_local._4_4_ =
                 nk_str_insert_at_char(pnStack_18,(int)pcVar1 - (int)pcVar2,_glyph_len,unicode);
          }
        }
      }
      return str_local._4_4_;
    }
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x20f3,"int nk_str_insert_at_rune(struct nk_str *, int, const char *, int)");
  }
  __assert_fail("cstr",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x20f2,"int nk_str_insert_at_rune(struct nk_str *, int, const char *, int)");
}

Assistant:

NK_API int
nk_str_insert_at_rune(struct nk_str *str, int pos, const char *cstr, int len)
{
    int glyph_len;
    nk_rune unicode;
    const char *begin;
    const char *buffer;

    NK_ASSERT(str);
    NK_ASSERT(cstr);
    NK_ASSERT(len);
    if (!str || !cstr || !len) return 0;
    begin = nk_str_at_rune(str, pos, &unicode, &glyph_len);
    if (!str->len)
        return nk_str_append_text_char(str, cstr, len);
    buffer = nk_str_get_const(str);
    if (!begin) return 0;
    return nk_str_insert_at_char(str, (int)(begin - buffer), cstr, len);
}